

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addUnknownChunks(ucvector *out,uchar *data,size_t datasize)

{
  uint uVar1;
  uchar *chunk;
  uchar *inchunk;
  
  if (datasize != 0) {
    chunk = data;
    do {
      uVar1 = lodepng_chunk_append(&out->data,&out->size,chunk);
      if (uVar1 != 0) {
        return uVar1;
      }
      out->allocsize = out->size;
      chunk = lodepng_chunk_next(chunk,data + datasize);
    } while ((ulong)((long)chunk - (long)data) < datasize);
  }
  return 0;
}

Assistant:

static unsigned addUnknownChunks(ucvector* out, unsigned char* data, size_t datasize) {
  unsigned char* inchunk = data;
  while((size_t)(inchunk - data) < datasize) {
    CERROR_TRY_RETURN(lodepng_chunk_append(&out->data, &out->size, inchunk));
    out->allocsize = out->size; /*fix the allocsize again*/
    inchunk = lodepng_chunk_next(inchunk, data + datasize);
  }
  return 0;
}